

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_iTXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_byte pVar1;
  png_uint_32 pVar2;
  int iVar3;
  png_bytep buf;
  long lVar4;
  png_bytep ppVar5;
  uint uVar6;
  char *pcVar7;
  int in_R8D;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  png_alloc_size_t uncompressed_length;
  png_text text;
  png_alloc_size_t local_78;
  png_inforp local_70;
  png_text local_68;
  
  pVar2 = png_ptr->user_chunk_cache_max;
  if (pVar2 != 0) {
    if (pVar2 == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    png_ptr->user_chunk_cache_max = pVar2 - 1;
    if (pVar2 - 1 == 1) {
      png_crc_finish(png_ptr,length);
      pcVar7 = "no space in chunk cache";
      goto LAB_00124850;
    }
  }
  uVar8 = png_ptr->mode;
  if ((uVar8 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((uVar8 & 4) != 0) {
    png_ptr->mode = uVar8 | 8;
  }
  buf = png_read_buffer(png_ptr,(ulong)(length + 1),1);
  if (buf != (png_bytep)0x0) {
    png_crc_read(png_ptr,buf,length);
    iVar3 = png_crc_finish(png_ptr,0);
    if (iVar3 == 0) {
      uVar8 = 0;
      if (length != 0) {
        lVar4 = 0;
        do {
          if (buf[lVar4] == '\0') {
            uVar8 = (uint)lVar4;
            break;
          }
          lVar4 = lVar4 + 1;
          uVar8 = length;
        } while (length != (png_uint_32)lVar4);
      }
      if (uVar8 - 0x50 < 0xffffffb1) {
        pcVar7 = "bad keyword";
      }
      else if (length < uVar8 + 5) {
        pcVar7 = "truncated";
      }
      else {
        pVar1 = buf[(ulong)uVar8 + 1];
        if ((pVar1 == '\0') ||
           ((pcVar7 = "bad compression info", pVar1 == '\x01' && (buf[(ulong)uVar8 + 2] == '\0'))))
        {
          local_78 = 0;
          uVar8 = uVar8 + 3;
          uVar10 = uVar8;
          if (uVar8 < length) {
            ppVar5 = buf + uVar8;
            uVar9 = uVar8;
            do {
              uVar10 = uVar9;
              if (*ppVar5 == '\0') break;
              uVar9 = uVar9 + 1;
              ppVar5 = ppVar5 + 1;
              uVar10 = length;
            } while (length != uVar9);
          }
          uVar10 = uVar10 + 1;
          uVar9 = uVar10;
          if (uVar10 < length) {
            ppVar5 = buf + uVar10;
            uVar6 = uVar10;
            do {
              uVar9 = uVar6;
              if (*ppVar5 == '\0') break;
              uVar6 = uVar6 + 1;
              ppVar5 = ppVar5 + 1;
              uVar9 = length;
            } while (length != uVar6);
          }
          uVar9 = uVar9 + 1;
          local_70 = info_ptr;
          if ((pVar1 == '\0') && (uVar9 <= length)) {
            pcVar7 = (char *)0x0;
            local_78 = (ulong)(length - uVar9);
          }
          else {
            pcVar7 = "truncated";
            if ((pVar1 != '\0') && (uVar9 < length)) {
              local_78 = 0xffffffffffffffff;
              iVar3 = png_decompress_chunk(png_ptr,length,uVar9,&local_78,in_R8D);
              if (iVar3 == 1) {
                buf = png_ptr->read_buffer;
                pcVar7 = (char *)0x0;
              }
              else {
                pcVar7 = (png_ptr->zstream).msg;
              }
            }
          }
          if (pcVar7 == (char *)0x0) {
            buf[local_78 + uVar9] = '\0';
            local_68.compression = 2 - (uint)(pVar1 == '\0');
            local_68.lang = (png_charp)(buf + uVar8);
            local_68.lang_key = (png_charp)(buf + uVar10);
            local_68.text = (png_charp)(buf + uVar9);
            local_68.text_length = 0;
            local_68.itxt_length = local_78;
            local_68.key = (png_charp)buf;
            iVar3 = png_set_text_2(png_ptr,local_70,&local_68,1);
            pcVar7 = "insufficient memory";
            if (iVar3 == 0) {
              pcVar7 = (png_const_charp)0x0;
            }
          }
        }
      }
      if (pcVar7 != (png_const_charp)0x0) {
        png_chunk_benign_error(png_ptr,pcVar7);
      }
    }
    return;
  }
  png_crc_finish(png_ptr,length);
  pcVar7 = "out of memory";
LAB_00124850:
  png_chunk_benign_error(png_ptr,pcVar7);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_iTXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_const_charp errmsg = NULL;
   png_bytep buffer;
   png_uint_32 prefix_length;

   png_debug(1, "in png_handle_iTXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   buffer = png_read_buffer(png_ptr, length+1, 1/*warn*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* First the keyword. */
   for (prefix_length=0;
      prefix_length < length && buffer[prefix_length] != 0;
      ++prefix_length)
      /* Empty loop */ ;

   /* Perform a basic check on the keyword length here. */
   if (prefix_length > 79 || prefix_length < 1)
      errmsg = "bad keyword";

   /* Expect keyword, compression flag, compression type, language, translated
    * keyword (both may be empty but are 0 terminated) then the text, which may
    * be empty.
    */
   else if (prefix_length + 5 > length)
      errmsg = "truncated";

   else if (buffer[prefix_length+1] == 0 ||
      (buffer[prefix_length+1] == 1 &&
      buffer[prefix_length+2] == PNG_COMPRESSION_TYPE_BASE))
   {
      int compressed = buffer[prefix_length+1] != 0;
      png_uint_32 language_offset, translated_keyword_offset;
      png_alloc_size_t uncompressed_length = 0;

      /* Now the language tag */
      prefix_length += 3;
      language_offset = prefix_length;

      for (; prefix_length < length && buffer[prefix_length] != 0;
         ++prefix_length)
         /* Empty loop */ ;

      /* WARNING: the length may be invalid here, this is checked below. */
      translated_keyword_offset = ++prefix_length;

      for (; prefix_length < length && buffer[prefix_length] != 0;
         ++prefix_length)
         /* Empty loop */ ;

      /* prefix_length should now be at the trailing '\0' of the translated
       * keyword, but it may already be over the end.  None of this arithmetic
       * can overflow because chunks are at most 2^31 bytes long, but on 16-bit
       * systems the available allocation may overflow.
       */
      ++prefix_length;

      if (compressed == 0 && prefix_length <= length)
         uncompressed_length = length - prefix_length;

      else if (compressed != 0 && prefix_length < length)
      {
         uncompressed_length = PNG_SIZE_MAX;

         /* TODO: at present png_decompress_chunk imposes a single application
          * level memory limit, this should be split to different values for
          * iCCP and text chunks.
          */
         if (png_decompress_chunk(png_ptr, length, prefix_length,
             &uncompressed_length, 1/*terminate*/) == Z_STREAM_END)
            buffer = png_ptr->read_buffer;

         else
            errmsg = png_ptr->zstream.msg;
      }

      else
         errmsg = "truncated";

      if (errmsg == NULL)
      {
         png_text text;

         buffer[uncompressed_length+prefix_length] = 0;

         if (compressed == 0)
            text.compression = PNG_ITXT_COMPRESSION_NONE;

         else
            text.compression = PNG_ITXT_COMPRESSION_zTXt;

         text.key = (png_charp)buffer;
         text.lang = (png_charp)buffer + language_offset;
         text.lang_key = (png_charp)buffer + translated_keyword_offset;
         text.text = (png_charp)buffer + prefix_length;
         text.text_length = 0;
         text.itxt_length = uncompressed_length;

         if (png_set_text_2(png_ptr, info_ptr, &text, 1) != 0)
            errmsg = "insufficient memory";
      }
   }

   else
      errmsg = "bad compression info";

   if (errmsg != NULL)
      png_chunk_benign_error(png_ptr, errmsg);
}